

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

EncodingResult<kj::String> *
kj::decodeUtf32(EncodingResult<kj::String> *__return_storage_ptr__,ArrayPtr<const_char32_t> utf16)

{
  ulong uVar1;
  ulong index;
  size_t sVar2;
  char32_t *pcVar3;
  Array<char> local_f0;
  String local_d8;
  int local_bc;
  StringPtr local_b8;
  byte local_a4;
  byte local_a3;
  byte local_a2;
  byte local_a1;
  initializer_list<char> local_a0;
  byte local_8b;
  byte local_8a;
  byte local_89;
  initializer_list<char> local_88;
  byte local_72;
  byte local_71;
  initializer_list<char> local_70;
  char32_t local_60 [2];
  char32_t u;
  ulong local_50;
  size_t i;
  undefined1 local_40 [7];
  bool hadErrors;
  Vector<char> result;
  ArrayPtr<const_char32_t> utf16_local;
  
  result.builder.disposer = (ArrayDisposer *)utf16.ptr;
  sVar2 = ArrayPtr<const_char32_t>::size((ArrayPtr<const_char32_t> *)&result.builder.disposer);
  Vector<char>::Vector((Vector<char> *)local_40,sVar2 + 1);
  i._7_1_ = 0;
  local_50 = 0;
  while( true ) {
    uVar1 = local_50;
    sVar2 = ArrayPtr<const_char32_t>::size((ArrayPtr<const_char32_t> *)&result.builder.disposer);
    index = local_50;
    if (sVar2 <= uVar1) break;
    local_50 = local_50 + 1;
    pcVar3 = ArrayPtr<const_char32_t>::operator[]
                       ((ArrayPtr<const_char32_t> *)&result.builder.disposer,index);
    local_60[0] = *pcVar3;
    if ((uint)local_60[0] < 0x80) {
      Vector<char>::add<char32_t&>((Vector<char> *)local_40,local_60);
    }
    else if ((uint)local_60[0] < 0x800) {
      local_72 = (byte)((uint)local_60[0] >> 6) | 0xc0;
      local_71 = (byte)local_60[0] & 0x3f | 0x80;
      local_70._M_array = (iterator)&local_72;
      local_70._M_len = 2;
      Vector<char>::addAll<std::initializer_list<char>>((Vector<char> *)local_40,&local_70);
    }
    else if ((uint)local_60[0] < 0x10000) {
      if ((local_60[0] & 0xfffff800U) == 0xd800) {
        i._7_1_ = 1;
      }
      local_8b = (byte)((uint)local_60[0] >> 0xc) | 0xe0;
      local_8a = (byte)((uint)local_60[0] >> 6) & 0x3f | 0x80;
      local_89 = (byte)local_60[0] & 0x3f | 0x80;
      local_88._M_array = (iterator)&local_8b;
      local_88._M_len = 3;
      Vector<char>::addAll<std::initializer_list<char>>((Vector<char> *)local_40,&local_88);
    }
    else if ((uint)local_60[0] < 0x110000) {
      local_a4 = (byte)((uint)local_60[0] >> 0x12) | 0xf0;
      local_a3 = (byte)((uint)local_60[0] >> 0xc) & 0x3f | 0x80;
      local_a2 = (byte)((uint)local_60[0] >> 6) & 0x3f | 0x80;
      local_a1 = (byte)local_60[0] & 0x3f | 0x80;
      local_a0._M_array = (iterator)&local_a4;
      local_a0._M_len = 4;
      Vector<char>::addAll<std::initializer_list<char>>((Vector<char> *)local_40,&local_a0);
    }
    else {
      StringPtr::StringPtr(&local_b8,anon_var_dwarf_3c01ae);
      Vector<char>::addAll<kj::StringPtr>((Vector<char> *)local_40,&local_b8);
      i._7_1_ = 1;
    }
  }
  local_bc = 0;
  Vector<char>::add<int>((Vector<char> *)local_40,&local_bc);
  Vector<char>::releaseAsArray(&local_f0,(Vector<char> *)local_40);
  String::String(&local_d8,&local_f0);
  EncodingResult<kj::String>::EncodingResult(__return_storage_ptr__,&local_d8,(bool)(i._7_1_ & 1));
  String::~String(&local_d8);
  Array<char>::~Array(&local_f0);
  Vector<char>::~Vector((Vector<char> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

EncodingResult<String> decodeUtf32(ArrayPtr<const char32_t> utf16) {
  Vector<char> result(utf16.size() + 1);
  bool hadErrors = false;

  size_t i = 0;
  while (i < utf16.size()) {
    char32_t u = utf16[i++];

    if (u < 0x80) {
      result.add(u);
      continue;
    } else if (u < 0x0800) {
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u >>  6)       ) | 0xc0),
        static_cast<char>(((u      ) & 0x3f) | 0x80)
      });
      continue;
    } else if (u < 0x10000) {
      if (KJ_UNLIKELY((u & 0xfffff800) == 0xd800)) {
        // no surrogates allowed in utf-32
        hadErrors = true;
      }
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u >> 12)       ) | 0xe0),
        static_cast<char>(((u >>  6) & 0x3f) | 0x80),
        static_cast<char>(((u      ) & 0x3f) | 0x80)
      });
      continue;
    } else {
      GOTO_ERROR_IF(u >= 0x110000);  // outside Unicode range
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u >> 18)       ) | 0xf0),
        static_cast<char>(((u >> 12) & 0x3f) | 0x80),
        static_cast<char>(((u >>  6) & 0x3f) | 0x80),
        static_cast<char>(((u      ) & 0x3f) | 0x80)
      });
      continue;
    }

  error:
    result.addAll(StringPtr(u8"\ufffd"));
    hadErrors = true;
  }

  result.add(0);
  return { String(result.releaseAsArray()), hadErrors };
}